

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O3

int __thiscall
sockpp::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  sockaddr *__addr_00;
  undefined8 uVar2;
  int *piVar3;
  socklen_t *__addr_len_00;
  undefined4 in_register_00000034;
  socklen_t len;
  socklen_t local_54;
  undefined **local_50;
  undefined4 local_48;
  socket local_40;
  
  if (__addr == (sockaddr *)0x0) {
    __addr_00 = (sockaddr *)0x0;
    __addr_len_00 = (socklen_t *)0x0;
    local_54 = 0;
  }
  else {
    __addr_00 = (sockaddr *)(**(code **)(*(long *)__addr + 0x18))(__addr);
    local_54 = (**(code **)(*(long *)__addr + 0x10))(__addr);
    __addr_len_00 = &local_54;
  }
  iVar1 = ::accept(*(int *)(CONCAT44(in_register_00000034,__fd) + 8),__addr_00,__addr_len_00);
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    uVar2 = std::_V2::system_category();
    if (iVar1 != 0) {
      (this->super_socket).handle_ = -1;
      (this->super_socket)._vptr_socket = (_func_int **)&PTR__socket_0010bc58;
      *(int *)&this[1].super_socket._vptr_socket = iVar1;
      *(undefined8 *)&this[1].super_socket.handle_ = uVar2;
      goto LAB_00106a60;
    }
    iVar1 = 0;
  }
  else {
    uVar2 = std::_V2::system_category();
  }
  (this->super_socket).handle_ = iVar1;
  local_48 = 0xffffffff;
  (this->super_socket)._vptr_socket = (_func_int **)&PTR__socket_0010bc58;
  *(undefined4 *)&this[1].super_socket._vptr_socket = 0;
  *(undefined8 *)&this[1].super_socket.handle_ = uVar2;
  local_50 = &PTR__socket_0010bba0;
  socket::close(&local_40,(int)&local_50);
LAB_00106a60:
  return (int)this;
}

Assistant:

result<stream_socket> acceptor::accept(sock_address* clientAddr /*=nullptr*/) noexcept {
    sockaddr* p = clientAddr ? clientAddr->sockaddr_ptr() : nullptr;
    socklen_t len = clientAddr ? clientAddr->size() : 0;

    if (auto res = check_socket(::accept(handle(), p, clientAddr ? &len : nullptr)); !res)
        return res.error();
    else
        return stream_socket{res.value()};
}